

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O0

float __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
::local_compute_reduced_cost<baryonyx::bit_array>
          (solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
           *this,int variable,bit_array *x)

{
  undefined1 auVar1 [16];
  __tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> *ppcVar2;
  __tuple_element_t<1UL,_tuple<col_value_*,_col_value_*>_> *ppcVar3;
  type piVar4;
  type pfVar5;
  unique_ptr<int[],_std::default_delete<int[]>_> *this_00;
  float fVar6;
  float fVar7;
  float a;
  type *hte;
  type *ht;
  float local_24;
  bit_array *pbStack_20;
  float sum_a_pi_p;
  bit_array *x_local;
  solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
  *psStack_10;
  int variable_local;
  solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
  *this_local;
  
  local_24 = 0.0;
  pbStack_20 = x;
  x_local._4_4_ = variable;
  psStack_10 = this;
  sparse_matrix<int>::column((sparse_matrix<int> *)&ht,(int)this + 0x10);
  ppcVar2 = std::
            get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                      ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                        *)&ht);
  ppcVar3 = std::
            get<1ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                      ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                        *)&ht);
  while (*ppcVar2 != *ppcVar3) {
    this_00 = &this->A;
    piVar4 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       (this_00,(long)(*ppcVar2)->value);
    fVar6 = (float)*piVar4;
    std::abs((int)this_00);
    pfVar5 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->pi,(long)(*ppcVar2)->row);
    fVar7 = *pfVar5;
    pfVar5 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->P,(long)(*ppcVar2)->value);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)(fVar7 + *pfVar5)),ZEXT416((uint)fVar6),
                             ZEXT416((uint)local_24));
    local_24 = auVar1._0_4_;
    *ppcVar2 = *ppcVar2 + 1;
  }
  fVar7 = quadratic_cost_type<float>::operator()(this->c,x_local._4_4_,pbStack_20);
  return fVar7 - local_24;
}

Assistant:

Float local_compute_reduced_cost(int variable, const Xtype& x) noexcept
    {
        Float sum_a_pi_p = 0;

        for (auto [ht, hte] = ap.column(variable); ht != hte; ++ht) {
            auto a = std::abs(static_cast<Float>(A[ht->value]));
            sum_a_pi_p += a * (pi[ht->row] + P[ht->value]);
        }

        return c(variable, x) - sum_a_pi_p;
    }